

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestDiagnosticInternal::Run(TestDiagnosticInternal *this)

{
  Outputter *pOVar1;
  char (*in_RDX) [13];
  char (*s) [13];
  int local_130;
  undefined1 local_129 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_120;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_std::ios_base_&(*)(std::ios_base_&)>_>
  local_118;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_std::ios_base_&(*)(std::ios_base_&)>,_int>_>
  local_100;
  testinator local_e0 [52];
  int local_ac [2];
  undefined1 local_a1 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_98;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_90;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>_>
  local_78;
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>,_int>_>
  local_58;
  testinator local_30 [32];
  TestDiagnosticInternal *local_10;
  TestDiagnosticInternal *this_local;
  
  pOVar1 = (this->super_Test).m_op;
  local_a1[0] = 0;
  local_10 = this;
  local_98 = testinator::operator<<
                       ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_a1,
                        (Cons<testinator::Nil> *)"Hello world ",in_RDX);
  local_ac[1] = 0x2a;
  testinator::operator<<
            (&local_90,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_a1 + 1),
             local_ac + 1);
  testinator::operator<<(&local_78,&local_90,std::endl<char,std::char_traits<char>>);
  local_ac[0] = 0x2a;
  testinator::operator<<(&local_58,&local_78,local_ac);
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,std::ostream&(*)(std::ostream&)>,int>>>
            (local_30,&local_58);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,local_30);
  std::__cxx11::string::~string((string *)local_30);
  pOVar1 = (this->super_Test).m_op;
  local_129[0] = 0;
  local_120 = testinator::operator<<
                        ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_129,
                         (Cons<testinator::Nil> *)"Hello world ",s);
  testinator::operator<<
            (&local_118,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_129 + 1),std::hex)
  ;
  local_130 = 0x2a;
  testinator::operator<<(&local_100,&local_118,&local_130);
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,std::ios_base&(*)(std::ios_base&)>,int>>>
            (local_e0,&local_100);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  return true;
}

Assistant:

virtual bool Run()
  {
    DIAGNOSTIC("Hello world " << 42 << endl << 42);
    DIAGNOSTIC("Hello world " << std::hex << 42);
    return true;
  }